

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_f9776f::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  ulong val;
  long lVar3;
  uint val_00;
  pointer pbVar4;
  string *name;
  ulong uVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value_00;
  string_view value_01;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  int local_198;
  uint local_18c;
  char *local_188;
  size_t local_180;
  char local_178;
  undefined7 uStack_177;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  size_t local_140;
  char *pcStack_138;
  undefined8 local_130;
  char *local_128;
  pointer local_120;
  char *pcStack_118;
  undefined8 local_110;
  char *local_108;
  size_t local_100;
  char *pcStack_f8;
  undefined8 local_f0;
  char *local_e8;
  string local_e0;
  undefined1 local_c0 [48];
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar4) < 0x80) {
    local_150._M_len = (size_t)&local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"sub-command GET requires at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((size_t *)local_150._M_len != &local_140) {
      operator_delete((void *)local_150._M_len,local_140 + 1);
    }
    bVar2 = false;
  }
  else {
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = GetList(&local_168,pbVar4 + 1,status->Makefile);
    name = pbVar1 + -1;
    if (bVar2) {
      if (local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_150._M_len = (size_t)&local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"GET given empty list","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((size_t *)local_150._M_len != &local_140) {
          operator_delete((void *)local_150._M_len,local_140 + 1);
        }
        bVar2 = false;
      }
      else {
        local_188 = &local_178;
        local_180 = 0;
        local_178 = '\0';
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (2 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) - 1U) {
          val = (long)local_168.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_168.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar5 = 2;
          lVar3 = 0x40;
          do {
            bVar2 = GetIndexArg((string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar3),
                                (int *)&local_18c,status->Makefile);
            if (!bVar2) {
              pbVar4 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pcStack_138 = *(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar3);
              local_140 = *(size_t *)((long)&pbVar4->_M_string_length + lVar3);
              local_150._M_len = 7;
              local_150._M_str = "index: ";
              local_130 = 0x15;
              local_128 = " is not a valid index";
              views_00._M_len = 3;
              views_00._M_array = &local_150;
              cmCatViews_abi_cxx11_((string *)local_c0,views_00);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
LAB_003265dd:
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
LAB_003265e5:
              bVar2 = false;
              goto LAB_003265e7;
            }
            std::__cxx11::string::append((char *)&local_188);
            val_00 = local_18c;
            if ((int)local_18c < 0) {
              local_198 = (int)val;
              val_00 = local_18c + local_198;
              if (-1 < (int)val_00) goto LAB_003263eb;
LAB_00326456:
              cmAlphaNum::cmAlphaNum(&local_90,val_00);
              local_150._M_len = 7;
              local_150._M_str = "index: ";
              local_140 = local_90.View_._M_len;
              pcStack_138 = local_90.View_._M_str;
              local_130 = 0x10;
              local_128 = " out of range (-";
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_c0,val);
              local_120 = (pointer)local_c0._0_8_;
              pcStack_118 = (char *)local_c0._8_8_;
              local_110 = 2;
              local_108 = ", ";
              cmAlphaNum::cmAlphaNum(&local_60,val - 1);
              local_100 = local_60.View_._M_len;
              pcStack_f8 = local_60.View_._M_str;
              local_f0 = 1;
              local_e8 = ")";
              views._M_len = 7;
              views._M_array = &local_150;
              cmCatViews_abi_cxx11_(&local_e0,views);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              local_c0._16_8_ = local_e0.field_2._M_allocated_capacity;
              local_c0._0_8_ = local_e0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_003265dd;
              goto LAB_003265e5;
            }
LAB_003263eb:
            if (val <= val_00) goto LAB_00326456;
            std::__cxx11::string::_M_append
                      ((char *)&local_188,
                       (ulong)local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[val_00]._M_dataplus._M_p);
            uVar5 = uVar5 + 1;
            pbVar4 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar3 = lVar3 + 0x20;
          } while (uVar5 < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) -
                           1U);
        }
        bVar2 = true;
        value_01._M_str = local_188;
        value_01._M_len = local_180;
        cmMakefile::AddDefinition(status->Makefile,name,value_01);
LAB_003265e7:
        if (local_188 != &local_178) {
          operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
        }
      }
    }
    else {
      bVar2 = true;
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value_00);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168);
  }
  return bVar2;
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command GET requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile())) {
    status.GetMakefile().AddDefinition(variableName, "NOTFOUND");
    return true;
  }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if (varArgsExpanded.empty()) {
    status.SetError("GET given empty list");
    return false;
  }

  std::string value;
  size_t cc;
  const char* sep = "";
  size_t nitem = varArgsExpanded.size();
  for (cc = 2; cc < args.size() - 1; cc++) {
    int item;
    if (!GetIndexArg(args[cc], &item, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    value += sep;
    sep = ";";
    if (item < 0) {
      item = static_cast<int>(nitem) + item;
    }
    if (item < 0 || nitem <= static_cast<size_t>(item)) {
      status.SetError(cmStrCat("index: ", item, " out of range (-", nitem,
                               ", ", nitem - 1, ")"));
      return false;
    }
    value += varArgsExpanded[item];
  }

  status.GetMakefile().AddDefinition(variableName, value);
  return true;
}